

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void matrixmultiply(float32 **c,float32 **a,float32 **b,int32 n)

{
  real local_34;
  char local_2e [2];
  float32 alpha;
  char uplo;
  char side;
  float32 **ppfStack_28;
  int32 n_local;
  float32 **b_local;
  float32 **a_local;
  float32 **c_local;
  
  local_2e[1] = 0x4c;
  local_2e[0] = 'L';
  local_34 = 1.0;
  alpha = (float32)n;
  ppfStack_28 = b;
  b_local = a;
  a_local = c;
  ssymm_(local_2e + 1,local_2e,(integer *)&alpha,(integer *)&alpha,&local_34,(real *)*a,
         (integer *)&alpha,(real *)*b,(integer *)&alpha,&local_34,(real *)*c,(integer *)&alpha);
  return;
}

Assistant:

void
matrixmultiply(float32 ** c, float32 ** a, float32 ** b, int32 n)
{
    char side, uplo;
    float32 alpha;

    side = 'L';
    uplo = 'L';
    alpha = 1.0;
    ssymm_(&side, &uplo, &n, &n, &alpha, a[0], &n, b[0], &n, &alpha, c[0], &n);
}